

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined2 *puVar6;
  long lVar7;
  boolean bVar8;
  uint uVar9;
  byte bVar10;
  long in_RSI;
  long *in_RDI;
  int look;
  int nb;
  jpeg_component_info *compptr;
  d_derived_tbl *tbl;
  savable_state_conflict1 state;
  bitread_working_state br_state;
  int bits_left;
  bit_buf_type get_buffer;
  JBLOCKROW block;
  int ci;
  int blkn;
  int r;
  int s;
  int Al;
  phuff_entropy_ptr_conflict entropy;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar11;
  bit_buf_type get_buffer_00;
  bitread_working_state *state_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uStack_80;
  ulong local_68;
  int local_60;
  int local_4c;
  ulong local_48;
  int local_30;
  uint local_28;
  boolean local_4;
  
  lVar3 = in_RDI[0x4a];
  lVar7 = in_RDI[0x43];
  if ((((int)in_RDI[0x2e] == 0) || (*(int *)(lVar3 + 0x3c) != 0)) ||
     (bVar8 = process_restart((j_decompress_ptr)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
     bVar8 != 0)) {
    if (*(int *)(lVar3 + 0x10) == 0) {
      uVar4 = *(undefined8 *)in_RDI[5];
      uVar5 = *(undefined8 *)(in_RDI[5] + 8);
      local_48 = *(ulong *)(lVar3 + 0x18);
      local_4c = *(int *)(lVar3 + 0x20);
      uVar12 = (undefined4)*(undefined8 *)(lVar3 + 0x28);
      uVar13 = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x28) >> 0x20);
      uVar14 = (undefined4)*(undefined8 *)(lVar3 + 0x30);
      uStack_80 = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x30) >> 0x20);
      uVar1 = *(undefined4 *)(lVar3 + 0x38);
      for (local_30 = 0; local_30 < (int)in_RDI[0x3c]; local_30 = local_30 + 1) {
        puVar6 = *(undefined2 **)(in_RSI + (long)local_30 * 8);
        iVar2 = *(int *)((long)in_RDI + (long)local_30 * 4 + 0x1e4);
        get_buffer_00 = in_RDI[(long)iVar2 + 0x37];
        state_00 = *(bitread_working_state **)
                    (lVar3 + 0x40 + (long)*(int *)(get_buffer_00 + 0x14) * 8);
        if (local_4c < 8) {
          bVar8 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)CONCAT44(uVar14,uVar13),
                             CONCAT44(uVar12,in_stack_ffffffffffffff70),
                             (int)((ulong)state_00 >> 0x20),(int)state_00);
          if (bVar8 == 0) {
            return 0;
          }
          local_48 = local_68;
          local_4c = local_60;
          if (7 < local_60) goto LAB_001515cc;
          iVar11 = 1;
LAB_00151632:
          local_28 = jpeg_huff_decode(state_00,get_buffer_00,iVar11,
                                      (d_derived_tbl *)
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                      in_stack_ffffffffffffff4c);
          if ((int)local_28 < 0) {
            return 0;
          }
          local_48 = local_68;
          local_4c = local_60;
        }
        else {
LAB_001515cc:
          uVar9 = (uint)(local_48 >> ((char)local_4c - 8U & 0x3f)) & 0xff;
          iVar11 = *(int *)((long)&state_00[7].get_buffer + (long)(int)uVar9 * 4) >> 8;
          if (8 < iVar11) goto LAB_00151632;
          local_4c = local_4c - iVar11;
          local_28 = *(uint *)((long)&state_00[7].get_buffer + (long)(int)uVar9 * 4) & 0xff;
        }
        if (local_28 != 0) {
          if (local_4c < (int)local_28) {
            bVar8 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)CONCAT44(uVar14,uVar13),
                               CONCAT44(uVar12,in_stack_ffffffffffffff70),
                               (int)((ulong)state_00 >> 0x20),(int)state_00);
            if (bVar8 == 0) {
              return 0;
            }
            local_48 = local_68;
            local_4c = local_60;
          }
          local_4c = local_4c - local_28;
          bVar10 = (byte)local_28;
          in_stack_ffffffffffffff54 =
               (uint)(local_48 >> ((byte)local_4c & 0x3f)) & (1 << (bVar10 & 0x1f)) - 1U;
          local_28 = in_stack_ffffffffffffff54;
          if ((int)in_stack_ffffffffffffff54 < 1 << (bVar10 - 1 & 0x1f)) {
            in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + (-1 << (bVar10 & 0x1f)) + 1;
            local_28 = in_stack_ffffffffffffff54;
          }
        }
        if (((-1 < *(int *)(&stack0xffffffffffffff78 + (long)iVar2 * 4)) &&
            (0x7fffffff - *(int *)(&stack0xffffffffffffff78 + (long)iVar2 * 4) < (int)local_28)) ||
           ((*(int *)(&stack0xffffffffffffff78 + (long)iVar2 * 4) < 0 &&
            ((int)local_28 < -0x80000000 - *(int *)(&stack0xffffffffffffff78 + (long)iVar2 * 4)))))
        {
          *(undefined4 *)(*in_RDI + 0x28) = 6;
          (**(code **)*in_RDI)(in_RDI);
        }
        iVar11 = *(int *)(&stack0xffffffffffffff78 + (long)iVar2 * 4);
        *(uint *)(&stack0xffffffffffffff78 + (long)iVar2 * 4) = iVar11 + local_28;
        *puVar6 = (short)((long)(int)(iVar11 + local_28) << ((byte)(int)lVar7 & 0x3f));
      }
      *(undefined8 *)in_RDI[5] = uVar4;
      *(undefined8 *)(in_RDI[5] + 8) = uVar5;
      *(ulong *)(lVar3 + 0x18) = local_48;
      *(int *)(lVar3 + 0x20) = local_4c;
      *(ulong *)(lVar3 + 0x28) = CONCAT44(uVar13,uVar12);
      *(ulong *)(lVar3 + 0x30) = CONCAT44(uStack_80,uVar14);
      *(undefined4 *)(lVar3 + 0x38) = uVar1;
    }
    if ((int)in_RDI[0x2e] != 0) {
      *(int *)(lVar3 + 0x3c) = *(int *)(lVar3 + 0x3c) + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2;  st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
        st = entropy->dc_stats[tbl] + 20;       /* Table F.4: X1 = 20 */
        while (arith_decode(cinfo, st)) {
          if ((m <<= 1) == 0x8000) {
            WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
            entropy->ct = -1;                   /* magnitude overflow */
            return TRUE;
          }
          st += 1;
        }
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;               /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
        entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        if (arith_decode(cinfo, st)) v |= m;
      v += 1;  if (sign) v = -v;
      entropy->last_dc_val[ci] = (entropy->last_dc_val[ci] + v) & 0xffff;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF)LEFT_SHIFT(entropy->last_dc_val[ci], cinfo->Al);
  }

  return TRUE;
}